

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham++.h
# Opt level: O0

bool __thiscall lzham_impl::load(lzham_impl *this)

{
  lzham_impl *this_local;
  
  (this->super_ilzham).lzham_get_version = lzham_get_version;
  (this->super_ilzham).lzham_set_memory_callbacks = lzham_set_memory_callbacks;
  (this->super_ilzham).lzham_compress_init = lzham_compress_init;
  (this->super_ilzham).lzham_compress_deinit = lzham_compress_deinit;
  (this->super_ilzham).lzham_compress = lzham_compress;
  (this->super_ilzham).lzham_compress_memory = lzham_compress_memory;
  (this->super_ilzham).lzham_decompress_init = lzham_decompress_init;
  (this->super_ilzham).lzham_decompress_deinit = lzham_decompress_deinit;
  (this->super_ilzham).lzham_decompress = lzham_decompress;
  (this->super_ilzham).lzham_decompress_memory = lzham_decompress_memory;
  return true;
}

Assistant:

virtual bool load()
   {
      this->lzham_get_version = ::lzham_get_version;
      this->lzham_set_memory_callbacks = ::lzham_set_memory_callbacks;
      this->lzham_compress_init = ::lzham_compress_init;
      this->lzham_compress_deinit = ::lzham_compress_deinit;
      this->lzham_compress = ::lzham_compress;
      this->lzham_compress_memory = ::lzham_compress_memory;
      this->lzham_decompress_init = ::lzham_decompress_init;
      this->lzham_decompress_deinit = ::lzham_decompress_deinit;
      this->lzham_decompress = ::lzham_decompress;
      this->lzham_decompress_memory = ::lzham_decompress_memory;
      return true;
   }